

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QChar __thiscall QVariant::toChar(QVariant *this)

{
  PrivateShared *pPVar1;
  ulong uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaType local_20;
  QMetaType local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QChar>::metaType;
  local_20.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_20,&local_18);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    local_20.d_ptr._0_2_ = *(undefined2 *)&(this->d).data;
  }
  else {
    local_20.d_ptr = (QMetaTypeInterface *)((ulong)local_20.d_ptr._2_6_ << 0x10);
    uVar2 = *(ulong *)&(this->d).field_0x18;
    if ((uVar2 & 1) != 0) {
      pPVar1 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar1->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar2 & 0xfffffffffffffffc),this,local_18,&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (QChar)(char16_t)local_20.d_ptr;
  }
  __stack_chk_fail();
}

Assistant:

QChar QVariant::toChar() const
{
    return qvariant_cast<QChar>(*this);
}